

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O3

bool IsFloat(char *str)

{
  char cVar1;
  char *start;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  
  cVar1 = *str;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    cVar1 = str[1];
    str = str + 1;
  }
  if (cVar1 != '.') {
    pcVar2 = str + -1;
    do {
      bVar3 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while ((byte)(bVar3 - 0x30) < 10);
    if (pcVar2 <= str) {
      return false;
    }
    str = pcVar2;
    if (bVar3 != 0x2e) goto LAB_0035c14f;
  }
  uVar4 = 0;
  do {
    bVar3 = str[uVar4 + 1];
    uVar4 = uVar4 + 1;
  } while ((byte)(bVar3 - 0x30) < 10);
  if (uVar4 < 2) {
    return false;
  }
  pcVar2 = str + uVar4;
LAB_0035c14f:
  if ((bVar3 | 0x20) == 0x65) {
    if ((pcVar2[1] == '-') || (pcVar2[1] == '+')) {
      pcVar2 = pcVar2 + 2;
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    pcVar5 = pcVar2 + -1;
    do {
      bVar3 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
    } while ((byte)(bVar3 - 0x30) < 10);
    if (pcVar5 <= pcVar2) {
      return false;
    }
  }
  return bVar3 == 0;
}

Assistant:

bool IsFloat (const char *str)
{
	const char *pt;
	
	if (*str == '+' || *str == '-')
		str++;

	if (*str == '.')
	{
		pt = str;
	}
	else
	{
		pt = IsNum (str);
		if (pt == NULL)
			return false;
	}
	if (*pt == '.')
	{
		pt = IsNum (pt+1);
		if (pt == NULL)
			return false;
	}
	if (*pt == 'e' || *pt == 'E')
	{
		pt++;
		if (*pt == '+' || *pt == '-')
			pt++;
		pt = IsNum (pt);
	}
	return pt != NULL && *pt == 0;
}